

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O0

QSharedPointer<QColorDialogOptions> QColorDialogOptions::create(void)

{
  Data *extraout_RDX;
  totally_ordered_wrapper<QColorDialogOptions_*> in_RDI;
  long in_FS_OFFSET;
  QSharedPointer<QColorDialogOptions> QVar1;
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined> *other;
  totally_ordered_wrapper<QColorDialogOptions_*> this;
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  other = &local_18;
  this.ptr = in_RDI.ptr;
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined>::create<>();
  QSharedPointer<QColorDialogOptions>::
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined,_true>
            ((QSharedPointer<QColorDialogOptions> *)this.ptr,other);
  QSharedPointer<(anonymous_namespace)::ColorDialogCombined>::~QSharedPointer
            ((QSharedPointer<(anonymous_namespace)::ColorDialogCombined> *)0x3b66ef);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.d = extraout_RDX;
    QVar1.value.ptr = in_RDI.ptr;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSharedPointer<QColorDialogOptions> QColorDialogOptions::create()
{
    return QSharedPointer<ColorDialogCombined>::create();
}